

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O2

float incircleexact(float *pa,float *pb,float *pc,float *pd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fStack_16e4;
  undefined8 local_1678;
  float local_1670;
  float local_166c;
  undefined8 local_1668;
  float local_1660;
  float local_165c;
  undefined8 local_1658;
  float local_1650;
  float local_164c;
  float local_1648;
  float fStack_1644;
  float fStack_1640;
  float fStack_163c;
  float local_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float local_1628;
  float fStack_1624;
  float fStack_1620;
  float fStack_161c;
  float local_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  float local_1608;
  float fStack_1604;
  float fStack_1600;
  float fStack_15fc;
  float local_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float local_15e8;
  float fStack_15e4;
  float fStack_15e0;
  float fStack_15dc;
  float local_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float local_15c8;
  float fStack_15c4;
  float fStack_15c0;
  float fStack_15bc;
  float local_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float local_15a8;
  float fStack_15a4;
  float fStack_15a0;
  float fStack_159c;
  float local_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  undefined8 local_1588;
  float local_1580;
  float local_157c;
  undefined8 local_1578;
  float local_1570;
  float local_156c;
  float temp8 [8];
  undefined8 local_1548;
  float local_1540;
  float local_153c;
  float dab [12];
  float cda [12];
  float abc [12];
  float det24y [24];
  float det24x [24];
  float bcd [12];
  float det48x [48];
  float cdet [96];
  float bdet [96];
  float adet [96];
  float det48y [48];
  float ddet [96];
  float deter [384];
  float cddet [192];
  float abdet [192];
  
  fVar7 = (float)*(undefined8 *)pb;
  fVar9 = (float)((ulong)*(undefined8 *)pb >> 0x20);
  fVar16 = (float)*(undefined8 *)pa;
  fVar18 = (float)((ulong)*(undefined8 *)pa >> 0x20);
  fVar8 = fVar9 * fVar16;
  fVar10 = fVar7 * fVar18;
  local_1608 = splitter * fVar9 - (splitter * fVar9 - fVar9);
  fStack_1604 = splitter * fVar7 - (splitter * fVar7 - fVar7);
  fStack_1600 = splitter * 0.0 - (splitter * 0.0 - 0.0);
  fStack_15fc = splitter * 0.0 - (splitter * 0.0 - 0.0);
  fStack_15d4 = fVar9 - local_1608;
  fStack_15cc = fVar7 - fStack_1604;
  fStack_1590 = 0.0 - fStack_1600;
  fStack_158c = 0.0 - fStack_15fc;
  local_1628 = splitter * fVar16 - (splitter * fVar16 - fVar16);
  fVar13 = splitter * fVar18 - (splitter * fVar18 - fVar18);
  fVar14 = splitter * 0.0 - (splitter * 0.0 - 0.0);
  fVar15 = splitter * 0.0 - (splitter * 0.0 - 0.0);
  fVar21 = fVar16 - local_1628;
  fStack_1614 = fVar18 - fVar13;
  fVar19 = fStack_15d4 * fVar21 -
           (((fVar8 - local_1628 * local_1608) - fVar21 * local_1608) - fStack_15d4 * local_1628);
  fVar20 = fStack_15cc * fStack_1614 -
           (((fVar10 - fStack_1604 * fVar13) - fStack_15cc * fVar13) - fStack_1614 * fStack_1604);
  fVar17 = fVar19 - fVar20;
  fVar11 = fVar8 + fVar17;
  fVar8 = (fVar8 - (fVar11 - (fVar11 - fVar8))) + (fVar17 - (fVar11 - fVar8));
  fVar12 = fVar8 - fVar10;
  local_1628 = -local_1628;
  fStack_1620 = -fStack_1604;
  fStack_15f0 = -fVar14;
  fStack_15ec = -fVar15;
  local_1578 = CONCAT44((fVar8 - (fVar12 + (fVar8 - fVar12))) + ((fVar8 - fVar12) - fVar10),
                        (fVar19 - (fVar17 + (fVar19 - fVar17))) + ((fVar19 - fVar17) - fVar20));
  local_156c = fVar11 + fVar12;
  local_1570 = (fVar11 - (local_156c - (local_156c - fVar11))) + (fVar12 - (local_156c - fVar11));
  fVar23 = (float)*(undefined8 *)pc;
  fVar25 = (float)((ulong)*(undefined8 *)pc >> 0x20);
  fVar17 = splitter * fVar23 - (splitter * fVar23 - fVar23);
  fVar22 = splitter * fVar25 - (splitter * fVar25 - fVar25);
  fStack_1640 = splitter * 0.0 - (splitter * 0.0 - 0.0);
  fStack_163c = splitter * 0.0 - (splitter * 0.0 - 0.0);
  fVar19 = (float)*(undefined8 *)pd;
  fVar20 = (float)((ulong)*(undefined8 *)pd >> 0x20);
  local_1638 = splitter * fVar20 - (splitter * fVar20 - fVar20);
  fStack_1634 = splitter * fVar19 - (splitter * fVar19 - fVar19);
  fStack_1630 = splitter * 0.0 - (splitter * 0.0 - 0.0);
  fStack_162c = splitter * 0.0 - (splitter * 0.0 - 0.0);
  fVar24 = fVar23 - fVar17;
  local_1618 = fVar25 - fVar22;
  fStack_1610 = 0.0 - fStack_1640;
  fStack_160c = 0.0 - fStack_163c;
  fStack_1624 = -fVar17;
  fStack_161c = -fStack_1634;
  local_15d8 = fVar20 - local_1638;
  fStack_15d0 = fVar19 - fStack_1634;
  fStack_15c0 = 0.0 - fStack_1630;
  fStack_15bc = 0.0 - fStack_162c;
  local_15a8 = fVar24 * local_15d8;
  fStack_15a4 = local_1618 * fStack_15d0;
  fStack_15a0 = fStack_1610 * fStack_15c0;
  fStack_159c = fStack_160c * fStack_15bc;
  local_15b8 = fVar21 * local_15d8;
  fStack_15b4 = fStack_1614 * fStack_15d0;
  fStack_15b0 = (0.0 - fVar14) * fStack_15c0;
  fStack_15ac = (0.0 - fVar15) * fStack_15bc;
  local_15e8 = fStack_15cc * local_15d8;
  fStack_15e4 = fStack_15d4 * fStack_15d0;
  fStack_15e0 = fStack_1590 * fStack_15c0;
  fStack_15dc = fStack_158c * fStack_15bc;
  local_1648 = local_15d8 * fVar17;
  fStack_1644 = local_1618 * fStack_1634;
  fStack_1640 = fStack_15c0 * fStack_1640;
  fStack_163c = fStack_15bc * fStack_163c;
  fStack_16e4 = -fVar24;
  fVar11 = fVar9 * fVar23;
  fVar10 = fVar7 * fVar25;
  fVar12 = fStack_15d4 * fVar24 -
           (fStack_1624 * fStack_15d4 + -fVar24 * local_1608 + fStack_1624 * local_1608 + fVar11);
  fVar14 = fStack_15cc * local_1618 -
           (local_1618 * fStack_1620 + fVar22 * -fStack_15cc + fVar22 * fStack_1620 + fVar10);
  fVar26 = fVar14 - fVar12;
  fVar8 = fVar10 + fVar26;
  fVar15 = (fVar10 - (fVar8 - (fVar8 - fVar10))) + (fVar26 - (fVar8 - fVar10));
  fVar10 = fVar15 - fVar11;
  local_1658 = CONCAT44((fVar15 - ((fVar15 - fVar10) + fVar10)) + ((fVar15 - fVar10) - fVar11),
                        (fVar14 - (fVar26 + (fVar14 - fVar26))) + ((fVar14 - fVar26) - fVar12));
  local_164c = fVar8 + fVar10;
  local_1650 = (fVar8 - (local_164c - (local_164c - fVar8))) + (fVar10 - (local_164c - fVar8));
  fVar8 = fVar23 * fVar20;
  fVar10 = fVar25 * fVar19;
  fVar12 = local_15a8 - (((fVar8 - fVar17 * local_1638) - local_1638 * fVar24) - local_1648);
  fVar15 = fStack_15a4 - (((fVar10 - fStack_1634 * fVar22) - fVar22 * fStack_15d0) - fStack_1644);
  fVar17 = fVar12 - fVar15;
  fVar14 = fVar8 + fVar17;
  fVar8 = (fVar8 - (fVar14 - (fVar14 - fVar8))) + (fVar17 - (fVar14 - fVar8));
  fVar11 = fVar8 - fVar10;
  local_1588 = CONCAT44((fVar8 - (fVar11 + (fVar8 - fVar11))) + ((fVar8 - fVar11) - fVar10),
                        (fVar12 - (fVar17 + (fVar12 - fVar17))) + ((fVar12 - fVar17) - fVar15));
  local_157c = fVar14 + fVar11;
  local_1580 = (fVar14 - (local_157c - (local_157c - fVar14))) + (fVar11 - (local_157c - fVar14));
  fVar14 = fVar16 * fVar20;
  fVar15 = fVar18 * fVar19;
  fVar8 = local_15b8 -
          (local_15d8 * local_1628 + -fVar21 * local_1638 + local_1628 * local_1638 + fVar14);
  fVar11 = fStack_15b4 -
           (fStack_1614 * fStack_161c + -fStack_15d0 * fVar13 + fStack_161c * fVar13 + fVar15);
  fVar12 = fVar11 - fVar8;
  fVar10 = fVar15 + fVar12;
  fVar15 = (fVar15 - (fVar10 - (fVar10 - fVar15))) + (fVar12 - (fVar10 - fVar15));
  fVar17 = fVar15 - fVar14;
  local_1548 = CONCAT44((fVar15 - ((fVar15 - fVar17) + fVar17)) + ((fVar15 - fVar17) - fVar14),
                        (fVar11 - (fVar12 + (fVar11 - fVar12))) + ((fVar11 - fVar12) - fVar8));
  local_153c = fVar10 + fVar17;
  local_1540 = (fVar10 - (local_153c - (local_153c - fVar10))) + (fVar17 - (local_153c - fVar10));
  fVar10 = fVar25 * fVar16;
  fVar11 = fVar23 * fVar18;
  fVar15 = local_1618 * fVar21 -
           (local_1618 * local_1628 + -fVar21 * fVar22 + local_1628 * fVar22 + fVar10);
  fVar13 = fVar24 * fStack_1614 -
           (fStack_1614 * fStack_1624 + fStack_16e4 * fVar13 + fStack_1624 * fVar13 + fVar11);
  fVar12 = fVar15 - fVar13;
  fVar8 = fVar10 + fVar12;
  fVar10 = (fVar10 - (fVar8 - (fVar8 - fVar10))) + (fVar12 - (fVar8 - fVar10));
  fVar14 = fVar10 - fVar11;
  local_1668 = CONCAT44((fVar10 - (fVar14 + (fVar10 - fVar14))) + ((fVar10 - fVar14) - fVar11),
                        (fVar15 - (fVar12 + (fVar15 - fVar12))) + ((fVar15 - fVar12) - fVar13));
  local_165c = fVar8 + fVar14;
  local_1660 = (fVar8 - (local_165c - (local_165c - fVar8))) + (fVar14 - (local_165c - fVar8));
  fVar11 = fVar20 * fVar7;
  fVar15 = fVar19 * fVar9;
  fVar10 = local_15e8 -
           (local_15d8 * fStack_1620 + -fStack_15cc * local_1638 + fStack_1620 * local_1638 + fVar11
           );
  fVar14 = fStack_15e4 -
           (fStack_15d4 * fStack_161c +
           -fStack_15d0 * local_1608 + fStack_161c * local_1608 + fVar15);
  fVar13 = fVar10 - fVar14;
  fVar8 = fVar11 + fVar13;
  fVar11 = (fVar11 - (fVar8 - (fVar8 - fVar11))) + (fVar13 - (fVar8 - fVar11));
  fVar12 = fVar11 - fVar15;
  local_1678 = CONCAT44((fVar11 - (fVar12 + (fVar11 - fVar12))) + ((fVar11 - fVar12) - fVar15),
                        (fVar10 - (fVar13 + (fVar10 - fVar13))) + ((fVar10 - fVar13) - fVar14));
  local_166c = fVar8 + fVar12;
  local_1670 = (fVar8 - (local_166c - (local_166c - fVar8))) + (fVar12 - (local_166c - fVar8));
  local_15f8 = fStack_1620;
  fStack_15f4 = fStack_161c;
  local_15c8 = local_15d8;
  fStack_15c4 = fStack_1614;
  local_1598 = fStack_15d4;
  fStack_1594 = fStack_1620;
  iVar1 = fast_expansion_sum_zeroelim(4,(float *)&local_1588,4,(float *)&local_1548,temp8);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,temp8,4,(float *)&local_1668,cda);
  iVar2 = fast_expansion_sum_zeroelim(4,(float *)&local_1548,4,(float *)&local_1578,temp8);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,temp8,4,(float *)&local_1678,dab);
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    *(uint *)((long)&local_1678 + lVar6 * 4) = *(uint *)((long)&local_1678 + lVar6 * 4) ^ 0x80000000
    ;
    *(uint *)((long)&local_1668 + lVar6 * 4) = *(uint *)((long)&local_1668 + lVar6 * 4) ^ 0x80000000
    ;
  }
  iVar3 = fast_expansion_sum_zeroelim(4,(float *)&local_1578,4,(float *)&local_1658,temp8);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,temp8,4,(float *)&local_1668,abc);
  iVar4 = fast_expansion_sum_zeroelim(4,(float *)&local_1658,4,(float *)&local_1588,temp8);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,temp8,4,(float *)&local_1678,bcd);
  iVar5 = scale_expansion_zeroelim(iVar4,bcd,SUB84((double)fVar16,0),det24x);
  iVar5 = scale_expansion_zeroelim(iVar5,det24x,SUB84((double)fVar16,0),det48x);
  iVar4 = scale_expansion_zeroelim(iVar4,bcd,SUB84((double)fVar18,0),det24y);
  iVar4 = scale_expansion_zeroelim(iVar4,det24y,SUB84((double)fVar18,0),det48y);
  iVar4 = fast_expansion_sum_zeroelim(iVar5,det48x,iVar4,det48y,adet);
  iVar5 = scale_expansion_zeroelim(iVar1,cda,SUB84((double)fVar7,0),det24x);
  iVar5 = scale_expansion_zeroelim(iVar5,det24x,SUB84((double)-fVar7,0),det48x);
  iVar1 = scale_expansion_zeroelim(iVar1,cda,SUB84((double)fVar9,0),det24y);
  iVar1 = scale_expansion_zeroelim(iVar1,det24y,SUB84((double)-fVar9,0),det48y);
  iVar1 = fast_expansion_sum_zeroelim(iVar5,det48x,iVar1,det48y,bdet);
  iVar5 = scale_expansion_zeroelim(iVar2,dab,SUB84((double)fVar23,0),det24x);
  iVar5 = scale_expansion_zeroelim(iVar5,det24x,SUB84((double)fVar23,0),det48x);
  iVar2 = scale_expansion_zeroelim(iVar2,dab,SUB84((double)fVar25,0),det24y);
  iVar2 = scale_expansion_zeroelim(iVar2,det24y,SUB84((double)fVar25,0),det48y);
  iVar2 = fast_expansion_sum_zeroelim(iVar5,det48x,iVar2,det48y,cdet);
  iVar5 = scale_expansion_zeroelim(iVar3,abc,SUB84((double)fVar19,0),det24x);
  iVar5 = scale_expansion_zeroelim(iVar5,det24x,SUB84((double)-fVar19,0),det48x);
  iVar3 = scale_expansion_zeroelim(iVar3,abc,SUB84((double)fVar20,0),det24y);
  iVar3 = scale_expansion_zeroelim(iVar3,det24y,SUB84((double)-fVar20,0),det48y);
  iVar3 = fast_expansion_sum_zeroelim(iVar5,det48x,iVar3,det48y,ddet);
  iVar1 = fast_expansion_sum_zeroelim(iVar4,adet,iVar1,bdet,abdet);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,cdet,iVar3,ddet,cddet);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,abdet,iVar2,cddet,deter);
  return ddet[(long)iVar1 + 0x5f];
}

Assistant:

REAL incircleexact(pa, pb, pc, pd)
REAL *pa;
REAL *pb;
REAL *pc;
REAL *pd;
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxay1, axcy1, bxdy1;
  INEXACT REAL bxay1, cxby1, dxcy1, axdy1, cxay1, dxby1;
  REAL axby0, bxcy0, cxdy0, dxay0, axcy0, bxdy0;
  REAL bxay0, cxby0, dxcy0, axdy0, cxay0, dxby0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  REAL temp8[8];
  int templen;
  REAL abc[12], bcd[12], cda[12], dab[12];
  int abclen, bcdlen, cdalen, dablen;
  REAL det24x[24], det24y[24], det48x[48], det48y[48];
  int xlen, ylen;
  REAL adet[96], bdet[96], cdet[96], ddet[96];
  int alen, blen, clen, dlen;
  REAL abdet[192], cddet[192];
  int ablen, cdlen;
  REAL deter[384];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  templen = fast_expansion_sum_zeroelim(4, cd, 4, da, temp8);
  cdalen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, cda);
  templen = fast_expansion_sum_zeroelim(4, da, 4, ab, temp8);
  dablen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, dab);
  for (i = 0; i < 4; i++) {
    bd[i] = -bd[i];
    ac[i] = -ac[i];
  }
  templen = fast_expansion_sum_zeroelim(4, ab, 4, bc, temp8);
  abclen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, abc);
  templen = fast_expansion_sum_zeroelim(4, bc, 4, cd, temp8);
  bcdlen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, bcd);

  xlen = scale_expansion_zeroelim(bcdlen, bcd, pa[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, pa[0], det48x);
  ylen = scale_expansion_zeroelim(bcdlen, bcd, pa[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, pa[1], det48y);
  alen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, adet);

  xlen = scale_expansion_zeroelim(cdalen, cda, pb[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, -pb[0], det48x);
  ylen = scale_expansion_zeroelim(cdalen, cda, pb[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, -pb[1], det48y);
  blen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, bdet);

  xlen = scale_expansion_zeroelim(dablen, dab, pc[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, pc[0], det48x);
  ylen = scale_expansion_zeroelim(dablen, dab, pc[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, pc[1], det48y);
  clen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, cdet);

  xlen = scale_expansion_zeroelim(abclen, abc, pd[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, -pd[0], det48x);
  ylen = scale_expansion_zeroelim(abclen, abc, pd[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, -pd[1], det48y);
  dlen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, deter);

  return deter[deterlen - 1];
}